

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

StreamOut * prvTidyUserOutput(TidyDocImpl *doc,TidyOutputSink *sink,int encoding,uint nl)

{
  StreamOut *pSVar1;
  StreamOut *out;
  uint nl_local;
  int encoding_local;
  TidyOutputSink *sink_local;
  TidyDocImpl *doc_local;
  
  pSVar1 = initStreamOut(doc,encoding,nl);
  (pSVar1->sink).sinkData = sink->sinkData;
  (pSVar1->sink).putByte = sink->putByte;
  pSVar1->iotype = UserIO;
  return pSVar1;
}

Assistant:

StreamOut* TY_(UserOutput)( TidyDocImpl *doc, TidyOutputSink* sink, int encoding, uint nl )
{
    StreamOut* out = initStreamOut( doc, encoding, nl );
    memcpy( &out->sink, sink, sizeof(TidyOutputSink) );
    out->iotype = UserIO;
    return out;
}